

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-bitmap.h
# Opt level: O1

int bitmap_ior(bitmap_t dst,bitmap_t src1,bitmap_t src2)

{
  byte bVar1;
  bitmap_el_t *pbVar2;
  bitmap_el_t *pbVar3;
  MIR_context_t ctx;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 extraout_RAX;
  bitmap_t pVVar5;
  bitmap_t extraout_RDX;
  char *pcVar6;
  bitmap_t unaff_RBX;
  bitmap_t pVVar7;
  bitmap_t bm;
  ulong unaff_RBP;
  bitmap_t pVVar8;
  bitmap_t nb;
  bitmap_t nb_00;
  char *pcVar9;
  bitmap_el_t bVar10;
  ulong uVar11;
  ulong uVar12;
  bitmap_el_t bVar13;
  bitmap_t pVVar14;
  ulong unaff_R12;
  ulong unaff_R13;
  bitmap_t unaff_R14;
  bitmap_t pVVar15;
  bitmap_t unaff_R15;
  bitmap_t pVVar16;
  undefined8 uVar17;
  
  nb = src1;
  bm = dst;
  if (src1 == (bitmap_t)0x0) {
LAB_00167d17:
    bitmap_ior_cold_4();
LAB_00167d1c:
    src1 = unaff_R15;
    dst = unaff_RBX;
    bitmap_ior_cold_3();
  }
  else {
    unaff_R14 = src2;
    if (src2 == (bitmap_t)0x0) goto LAB_00167d1c;
    unaff_R12 = src1->els_num;
    unaff_R13 = src2->els_num;
    unaff_RBP = unaff_R13;
    if (unaff_R13 < unaff_R12) {
      unaff_RBP = unaff_R12;
    }
    nb = (bitmap_t)(unaff_RBP << 6);
    bitmap_expand(dst,(size_t)nb);
    if (dst != (bitmap_t)0x0) {
      pbVar2 = dst->varr;
      if (unaff_RBP == 0) {
        uVar12 = 0;
        iVar4 = 0;
      }
      else {
        nb = (bitmap_t)src1->varr;
        bm = (bitmap_t)src2->varr;
        iVar4 = 0;
        uVar11 = 0;
        uVar12 = 0;
        do {
          if (uVar11 < unaff_R12) {
            bVar10 = (&nb->els_num)[uVar11];
          }
          else {
            bVar10 = 0;
          }
          if (uVar11 < unaff_R13) {
            bVar13 = (&bm->els_num)[uVar11];
          }
          else {
            bVar13 = 0;
          }
          src2 = (bitmap_t)pbVar2[uVar11];
          pVVar14 = (bitmap_t)(bVar13 | bVar10);
          pbVar2[uVar11] = (bitmap_el_t)pVVar14;
          uVar11 = uVar11 + 1;
          if (pVVar14 != (bitmap_t)0x0) {
            uVar12 = uVar11;
          }
          if (src2 != pVVar14) {
            iVar4 = 1;
          }
        } while (unaff_RBP != uVar11);
      }
      if ((pbVar2 != (bitmap_el_t *)0x0) && (uVar12 <= dst->els_num)) {
        dst->els_num = uVar12;
        return iVar4;
      }
      bitmap_ior_cold_1();
      unaff_RBX = dst;
      unaff_R14 = src2;
      unaff_R15 = src1;
      goto LAB_00167d17;
    }
  }
  bitmap_ior_cold_2();
  pVVar7 = dst;
  nb_00 = nb;
  pVVar14 = bm;
  pVVar15 = unaff_R14;
  pVVar16 = src1;
  uVar17 = extraout_RAX;
  if (nb == (bitmap_t)0x0) {
LAB_00167ddf:
    bitmap_and_compl_cold_4();
  }
  else {
    pVVar15 = extraout_RDX;
    if (extraout_RDX != (bitmap_t)0x0) {
      pVVar7 = (bitmap_t)nb->els_num;
      pVVar16 = (bitmap_t)extraout_RDX->els_num;
      pVVar8 = pVVar16;
      if (pVVar16 < pVVar7) {
        pVVar8 = pVVar7;
      }
      nb_00 = (bitmap_t)((long)pVVar8 << 6);
      bitmap_expand(bm,(size_t)nb_00);
      if (bm == (bitmap_t)0x0) goto LAB_00167de9;
      pbVar2 = bm->varr;
      if (pVVar8 == (bitmap_t)0x0) {
        pVVar5 = (bitmap_t)0x0;
      }
      else {
        pbVar3 = nb->varr;
        nb_00 = (bitmap_t)extraout_RDX->varr;
        pVVar14 = (bitmap_t)0x0;
        pVVar5 = (bitmap_t)0x0;
        do {
          if (pVVar14 < pVVar7) {
            bVar10 = pbVar3[(long)pVVar14];
          }
          else {
            bVar10 = 0;
          }
          uVar12 = 0xffffffffffffffff;
          if (pVVar14 < pVVar16) {
            uVar12 = ~(&nb_00->els_num)[(long)pVVar14];
          }
          pbVar2[(long)pVVar14] = uVar12 & bVar10;
          pVVar14 = (bitmap_t)((long)&pVVar14->els_num + 1);
          if ((uVar12 & bVar10) != 0) {
            pVVar5 = pVVar14;
          }
        } while (pVVar8 != pVVar14);
      }
      if ((pbVar2 != (bitmap_el_t *)0x0) && (pVVar5 <= (bitmap_t)bm->els_num)) {
        bm->els_num = (size_t)pVVar5;
        return (int)pbVar2;
      }
      bitmap_and_compl_cold_1();
      pVVar7 = bm;
      pVVar16 = nb;
      goto LAB_00167ddf;
    }
  }
  nb = pVVar16;
  bm = pVVar7;
  bitmap_and_compl_cold_3();
LAB_00167de9:
  bitmap_and_compl_cold_2();
  if (((FILE *)pVVar14[1].els_num != (FILE *)0x0) && (1 < (int)pVVar14[1].size)) {
    ctx = (MIR_context_t)pVVar14->els_num;
    bVar1 = *(byte *)((long)&nb_00->size + 1);
    pcVar9 = "may/must alloca ";
    if ((bVar1 & 3) == 0) {
      pcVar9 = "must alloca";
    }
    pcVar6 = "";
    if (bVar1 != 0) {
      pcVar6 = pcVar9;
    }
    pcVar9 = "const val";
    if ((char)nb_00->size == '\0') {
      pcVar9 = "val";
    }
    fprintf((FILE *)pVVar14[1].els_num,"%s%s=%lld for insn %lu:",pcVar6,pcVar9,nb_00[1].els_num,
            (ulong)*(uint *)((long)&nb_00->size + 4),bm,pVVar15,nb,uVar17,dst,unaff_R12,unaff_R13,
            unaff_R14,src1,unaff_RBP);
    MIR_output_insn(ctx,(FILE *)pVVar14[1].els_num,(MIR_insn_t_conflict)nb_00->els_num,
                    (MIR_func_t)pVVar14->varr[8],1);
    return extraout_EAX_00;
  }
  return extraout_EAX;
}

Assistant:

static inline int bitmap_ior (bitmap_t dst, bitmap_t src1, bitmap_t src2) {
  return bitmap_op2 (dst, src1, src2, bitmap_el_ior);
}